

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::Compiler::get_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  Decoration *pDVar1;
  bool bVar2;
  Meta *pMVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  
  pMVar3 = ParsedIR::find_meta(&this->ir,(ID)type);
  uVar6 = 0;
  if ((pMVar3 != (Meta *)0x0) &&
     (uVar5 = (ulong)index, uVar6 = 0,
     uVar5 < (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size)) {
    pDVar1 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    bVar2 = Bitset::get(&pDVar1[uVar5].extended.flags,decoration);
    if (bVar2) {
      puVar4 = pDVar1[uVar5].extended.values + decoration;
    }
    else {
      if (5 < decoration - SPIRVCrossDecorationInterfaceMemberIndex) {
        return 0;
      }
      puVar4 = (uint32_t *)
               (&DAT_00396c8c + (ulong)(decoration - SPIRVCrossDecorationInterfaceMemberIndex) * 4);
    }
    uVar6 = *puVar4;
  }
  return uVar6;
}

Assistant:

uint32_t Compiler::get_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);
	return dec.extended.values[decoration];
}